

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.cpp
# Opt level: O2

void sqlcheck::ValidateColorMode(Configuration *state)

{
  bool *in_RDX;
  string local_28;
  
  GetBooleanString_abi_cxx11_(&local_28,(sqlcheck *)state,in_RDX);
  printf("> %s :: %s\n","COLOR MODE   ",local_28._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void ValidateColorMode(const Configuration &state) {
    printf("> %s :: %s\n", "COLOR MODE   ",
           GetBooleanString(state.color_mode).c_str());
}